

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
::
RU_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
           *this,vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 *orderedBoundaries,Column_settings *colSettings)

{
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
  *this_00;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *column;
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  pointer pvVar4;
  ulong uVar5;
  int dim;
  uint pos;
  size_type sVar6;
  Pos_index target;
  ulong uVar7;
  long lVar8;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_50;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
  *local_40;
  pair<unsigned_int,_unsigned_int> local_38;
  
  *(undefined8 *)(this + 0x20) = 0;
  *(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
    **)this = this + 0x30;
  *(undefined8 *)(this + 8) = 1;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined4 *)(this + 0x20) = 0x3f800000;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
    **)(this + 0x68) = this + 0x98;
  *(undefined8 *)(this + 0x70) = 1;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined4 *)(this + 0x88) = 0x3f800000;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined8 *)(this + 0xb0) = 0;
  *(undefined8 *)(this + 0xb8) = 0;
  *(undefined8 *)(this + 0xc0) = 0;
  *(undefined8 *)(this + 200) = 0;
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  *(undefined4 *)(this + 0xe8) = 0xffffffff;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  sVar6 = ((long)(orderedBoundaries->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(orderedBoundaries->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  *(int *)(this + 0x108) = (int)sVar6;
  *(Column_settings **)(this + 0x110) = colSettings;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
  ::reserve((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
             *)(this + 0xf0),sVar6);
  pvVar4 = (orderedBoundaries->
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((orderedBoundaries->
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar4) {
    sVar6 = 0;
  }
  else {
    uVar7 = 0;
    do {
      column = pvVar4 + uVar7;
      ppVar1 = (column->
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      ppVar2 = (column->
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dim = (int)((ulong)((long)ppVar1 - (long)ppVar2) >> 3) + -1;
      if (ppVar1 == ppVar2) {
        dim = 0;
      }
      Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
      ::
      _container_insert<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
                  *)(this + 0xd0),column,(Index)uVar7,dim);
      uVar7 = (ulong)((Index)uVar7 + 1);
      pvVar4 = (orderedBoundaries->
               super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      sVar6 = ((long)(orderedBoundaries->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
              -0x5555555555555555;
    } while (uVar7 <= sVar6 && sVar6 - uVar7 != 0);
  }
  this_00 = (Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
             *)(this + 0x118);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
  ::vector((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
            *)this_00,sVar6,(allocator_type *)&local_50);
  *(undefined4 *)(this + 0x130) = 0;
  *(Column_settings **)(this + 0x138) = colSettings;
  local_40 = this + 0x140;
  *(undefined8 *)(this + 0x140) = 0;
  *(undefined8 *)(this + 0x148) = 0;
  *(undefined8 *)(this + 0x150) = 0;
  sVar6 = ((long)(orderedBoundaries->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(orderedBoundaries->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  *(int *)(this + 0x158) = (int)sVar6;
  *(Column_settings **)(this + 0x160) = colSettings;
  local_50._M_array = (iterator)CONCAT44(local_50._M_array._4_4_,0xffffffff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,sVar6,
             (value_type_conflict *)&local_50);
  if (*(int *)(this + 0x108) == 0) {
    sVar6 = 0;
  }
  else {
    pos = *(uint *)(this + 0x130);
    uVar7 = 0;
    do {
      local_38 = (pair<unsigned_int,_unsigned_int>)(uVar7 + 0x100000000);
      local_50._M_array = &local_38;
      local_50._M_len = 1;
      uVar5 = (*(long *)(this + 0x120) - *(long *)(this + 0x118) >> 3) * -0x3333333333333333;
      if (uVar5 < pos || uVar5 - pos == 0) {
        std::
        vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
        ::resize((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
                  *)this_00,(ulong)(pos + 1));
      }
      Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
      ::_container_insert<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
                (this_00,&local_50,pos,0);
      pos = *(int *)(this + 0x130) + 1;
      *(uint *)(this + 0x130) = pos;
      uVar7 = uVar7 + 1;
      sVar6 = (size_type)*(uint *)(this + 0x108);
    } while (uVar7 < sVar6);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x50),sVar6);
  if (*(int *)(this + 0x108) != 0) {
    lVar8 = 0x18;
    uVar7 = 0;
    do {
      lVar3 = *(long *)(this + 0xf0);
      target = (Pos_index)uVar7;
      if (lVar3 + lVar8 == *(long *)(lVar3 + lVar8) || *(long *)(lVar3 + lVar8) == 0) {
        RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
        ::_add_bar((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
                    *)this,*(Dimension *)(lVar3 + -0x18 + lVar8),target);
      }
      else {
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
        ::_reduce_column((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
                          *)this,target,target);
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x28;
    } while (uVar7 < *(uint *)(this + 0x108));
  }
  return;
}

Assistant:

inline RU_matrix<Master_matrix>::RU_matrix(const std::vector<Boundary_range>& orderedBoundaries,
                                           Column_settings* colSettings)
    : Pair_opt(),
      Swap_opt(),
      Rep_opt(),
      reducedMatrixR_(orderedBoundaries, colSettings),
      mirrorMatrixU_(orderedBoundaries.size(), colSettings),
      nextEventIndex_(orderedBoundaries.size()),
      operators_(nullptr)
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    operators_ = &(colSettings->operators);
  }

  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.reserve(orderedBoundaries.size());
  } else {
    pivotToColumnIndex_.resize(orderedBoundaries.size(), Master_matrix::template get_null_value<Index>());
  }

  _initialize_U();
  _reduce();
}